

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.h
# Opt level: O0

void __thiscall SNMPTrap::SNMPTrap(SNMPTrap *this,char *community,SNMP_VERSION version)

{
  char *pcVar1;
  OIDType *pOVar2;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78;
  undefined1 local_52;
  allocator local_51;
  string local_50;
  SNMP_VERSION local_1c;
  char *pcStack_18;
  SNMP_VERSION version_local;
  char *community_local;
  SNMPTrap *this_local;
  
  local_1c = version;
  pcStack_18 = community;
  community_local = (char *)this;
  SNMPPacket::SNMPPacket(&this->super_SNMPPacket);
  (this->super_SNMPPacket)._vptr_SNMPPacket = (_func_int **)&PTR__SNMPTrap_0028f958;
  IPAddress::IPAddress(&this->agentIP);
  this->trapOID = (OIDType *)0x0;
  this->uptimeCallback = (TimestampCallback *)0x0;
  this->genericTrap = 6;
  this->specificTrap = 1;
  this->trapUDPport = 0xa2;
  this->inform = false;
  this->_udp = (UDP *)0x0;
  Catch::clara::std::__cxx11::list<ValueCallback_*,_std::allocator<ValueCallback_*>_>::list
            ((list<ValueCallback_*,_std::allocator<ValueCallback_*>_> *)&this->callbacks);
  pOVar2 = (OIDType *)operator_new(0x50);
  local_52 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,".1.3.6.1.2.1.1.3.0",&local_51);
  OIDType::OIDType(pOVar2,&local_50);
  local_52 = 0;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  this->timestampOID = pOVar2;
  pOVar2 = (OIDType *)operator_new(0x50);
  local_7a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,".1.3.6.1.2.1.1.2.0",&local_79);
  OIDType::OIDType(pOVar2,&local_78);
  local_7a = 0;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  this->snmpTrapOID = pOVar2;
  SNMPPacket::setVersion(&this->super_SNMPPacket,local_1c);
  SNMPPacket::setPDUType(&this->super_SNMPPacket,Trapv2PDU);
  pcVar1 = pcStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
  SNMPPacket::setCommunityString(&this->super_SNMPPacket,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return;
}

Assistant:

SNMPTrap(const char* community, SNMP_VERSION version){
        this->setVersion(version);
        // Version two will use the SNMPPacket builder which uses the member pduType
        // Version one will use special builder with hardcoded PDU Type
        this->setPDUType(Trapv2PDU);
        this->setCommunityString(community);
    }